

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_sender.c
# Opt level: O2

void on_link_flow_on(void *context)

{
  ASYNC_OPERATION_HANDLE pAVar1;
  ASYNC_OPERATION_CANCEL_HANDLER_FUNC p_Var2;
  SEND_ONE_MESSAGE_RESULT SVar3;
  LOGGER_LOG p_Var4;
  ulong index;
  
  for (index = 0; index < *(ulong *)((long)context + 8); index = index + 1) {
    pAVar1 = *(ASYNC_OPERATION_HANDLE *)(*(long *)((long)context + 0x10) + index * 8);
    if (*(int *)&pAVar1[5].async_operation_cancel_handler == 0) {
      SVar3 = send_one_message((MESSAGE_SENDER_INSTANCE *)context,pAVar1,
                               (MESSAGE_HANDLE)pAVar1[1].async_operation_cancel_handler);
      if (SVar3 != SEND_ONE_MESSAGE_OK) {
        if (SVar3 == SEND_ONE_MESSAGE_ERROR) {
          p_Var2 = pAVar1[2].async_operation_cancel_handler;
          pAVar1 = (ASYNC_OPERATION_HANDLE)pAVar1[3].async_operation_cancel_handler;
          remove_pending_message_by_index((MESSAGE_SENDER_HANDLE)context,index);
          if (p_Var2 != (ASYNC_OPERATION_CANCEL_HANDLER_FUNC)0x0) {
            (*p_Var2)(pAVar1);
          }
          index = *(ulong *)((long)context + 8);
        }
        else if (SVar3 == SEND_ONE_MESSAGE_BUSY) {
          index = *(long *)((long)context + 8) + 1;
        }
        else {
          p_Var4 = xlogging_get_log_function();
          if (p_Var4 != (LOGGER_LOG)0x0) {
            (*p_Var4)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/message_sender.c"
                      ,"send_all_pending_messages",0x28e,1,"Invalid send one message result");
          }
        }
      }
      index = index - 1;
    }
  }
  return;
}

Assistant:

static void on_link_flow_on(void* context)
{
    MESSAGE_SENDER_HANDLE message_sender = (MESSAGE_SENDER_INSTANCE*)context;
    send_all_pending_messages(message_sender);
}